

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

TernaryOp * __thiscall
soul::PoolAllocator::
allocate<soul::AST::TernaryOp,soul::AST::Context&,soul::AST::Expression&,soul::AST::Expression&,soul::AST::Expression&>
          (PoolAllocator *this,Context *args,Expression *args_1,Expression *args_2,
          Expression *args_3)

{
  DestructorFn *pDVar1;
  Context *this_00;
  _lambda_void___1_ local_41;
  TernaryOp *local_40;
  TernaryOp *newObject;
  PoolItem *newItem;
  Expression *args_local_3;
  Expression *args_local_2;
  Expression *args_local_1;
  Context *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args_3;
  args_local_3 = args_2;
  args_local_2 = args_1;
  args_local_1 = (Expression *)args;
  args_local = (Context *)this;
  newObject = (TernaryOp *)allocateSpaceForObject(this,0x48);
  this_00 = &(newObject->super_Expression).super_Statement.super_ASTObject.context;
  AST::TernaryOp::TernaryOp
            ((TernaryOp *)this_00,(Context *)args_local_1,args_local_2,args_local_3,
             (Expression *)newItem);
  local_40 = (TernaryOp *)this_00;
  pDVar1 = allocate(soul::AST::Context&,soul::AST::Expression&,soul::AST::Expression&,soul::AST::Expression&)
           ::{lambda(void*)#1}::operator_cast_to_function_pointer(&local_41);
  *(DestructorFn **)&(newObject->super_Expression).super_Statement.super_ASTObject.objectType =
       pDVar1;
  return local_40;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }